

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFListTable.h
# Opt level: O0

Error __thiscall
llvm::DWARFListType<llvm::RangeListEntry>::extract
          (DWARFListType<llvm::RangeListEntry> *this,DWARFDataExtractor Data,uint64_t HeaderOffset,
          uint64_t End,uint64_t *OffsetPtr,StringRef SectionName,StringRef ListTypeString)

{
  DWARFDataExtractor Data_00;
  bool bVar1;
  error_code EC;
  error_code EC_00;
  char *local_d8;
  error_code local_d0;
  Error local_c0;
  uint local_b8;
  char *local_a8;
  size_t sStack_a0;
  undefined8 local_98;
  DWARFObject *pDStack_90;
  DWARFSection *local_88;
  byte local_71;
  undefined1 local_70 [8];
  RangeListEntry Entry;
  error_code local_40;
  ulong *local_30;
  uint64_t *OffsetPtr_local;
  uint64_t End_local;
  uint64_t HeaderOffset_local;
  DWARFListType<llvm::RangeListEntry> *this_local;
  Error *E;
  
  Data_00 = Data;
  local_30 = (ulong *)SectionName.Data;
  OffsetPtr_local = OffsetPtr;
  End_local = End;
  HeaderOffset_local = HeaderOffset;
  this_local = this;
  if ((*local_30 < End) || (OffsetPtr <= (uint64_t *)*local_30)) {
    std::error_code::error_code<llvm::errc,void>(&local_40,invalid_argument);
    Entry.Value1 = (uint64_t)StringRef::data((StringRef *)&stack0x00000040);
    EC._M_cat._0_4_ = local_40._M_value;
    EC._0_8_ = this;
    EC._M_cat._4_4_ = 0;
    createStringError<char_const*,unsigned_long>
              (EC,(char *)local_40._M_cat,(char **)"invalid %s list offset 0x%lx",&Entry.Value1);
  }
  else {
    std::vector<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_>::clear
              ((vector<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_> *)HeaderOffset);
    do {
      if (OffsetPtr_local <= (uint64_t *)*local_30) {
        std::error_code::error_code<llvm::errc,void>(&local_d0,illegal_byte_sequence);
        local_d8 = StringRef::data(&ListTypeString);
        EC_00._M_cat._0_4_ = local_d0._M_value;
        EC_00._0_8_ = this;
        EC_00._M_cat._4_4_ = 0;
        createStringError<char_const*,unsigned_long>
                  (EC_00,(char *)local_d0._M_cat,
                   (char **)
                   "no end of list marker detected at end of %s table starting at offset 0x%lx",
                   (unsigned_long *)&local_d8);
        return (Error)(ErrorInfoBase *)this;
      }
      local_71 = 0;
      Data.Section = Data_00.Section;
      local_88 = Data.Section;
      Data.super_DataExtractor.Data.Data = Data_00.super_DataExtractor.Data.Data;
      local_a8 = Data.super_DataExtractor.Data.Data;
      Data.super_DataExtractor.Data.Length = Data_00.super_DataExtractor.Data.Length;
      sStack_a0 = Data.super_DataExtractor.Data.Length;
      Data.super_DataExtractor._16_8_ = Data_00.super_DataExtractor._16_8_;
      local_98._0_1_ = Data.super_DataExtractor.IsLittleEndian;
      local_98._1_1_ = Data.super_DataExtractor.AddressSize;
      local_98._2_6_ = Data.super_DataExtractor._18_6_;
      Data.Obj = Data_00.Obj;
      pDStack_90 = Data.Obj;
      RangeListEntry::extract((RangeListEntry *)this,Data_00,(uint64_t)local_70,OffsetPtr_local);
      bVar1 = Error::operator_cast_to_bool((Error *)this);
      if (bVar1) {
        local_71 = 1;
      }
      local_b8 = (uint)bVar1;
      if ((local_71 & 1) == 0) {
        Error::~Error((Error *)this);
      }
      if (local_b8 != 0) {
        return (Error)(ErrorInfoBase *)this;
      }
      std::vector<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_>::push_back
                ((vector<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_> *)HeaderOffset
                 ,(value_type *)local_70);
      bVar1 = RangeListEntry::isSentinel((RangeListEntry *)local_70);
    } while (!bVar1);
    Error::success();
    Error::Error((Error *)this,&local_c0);
    ErrorSuccess::~ErrorSuccess((ErrorSuccess *)&local_c0);
  }
  return (Error)(ErrorInfoBase *)this;
}

Assistant:

Error DWARFListType<ListEntryType>::extract(DWARFDataExtractor Data,
                                            uint64_t HeaderOffset, uint64_t End,
                                            uint64_t *OffsetPtr,
                                            StringRef SectionName,
                                            StringRef ListTypeString) {
  if (*OffsetPtr < HeaderOffset || *OffsetPtr >= End)
    return createStringError(errc::invalid_argument,
                       "invalid %s list offset 0x%" PRIx64,
                       ListTypeString.data(), *OffsetPtr);
  Entries.clear();
  while (*OffsetPtr < End) {
    ListEntryType Entry;
    if (Error E = Entry.extract(Data, End, OffsetPtr))
      return E;
    Entries.push_back(Entry);
    if (Entry.isSentinel())
      return Error::success();
  }
  return createStringError(errc::illegal_byte_sequence,
                     "no end of list marker detected at end of %s table "
                     "starting at offset 0x%" PRIx64,
                     SectionName.data(), HeaderOffset);
}